

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
::walk(Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
       *this,Expression **root)

{
  size_t sVar1;
  pointer pTVar2;
  pointer pTVar3;
  TaskFunc p_Var4;
  Expression **ppEVar5;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::(anonymous namespace)::Heap2LocalPass, wasm::Visitor<wasm::(anonymous namespace)::Heap2LocalPass>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Heap2LocalPass, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Heap2LocalPass>]"
                 );
  }
  pushTask(this,PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
                ::scan,root);
  while( true ) {
    sVar1 = (this->stack).usedFixed;
    pTVar2 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((long)pTVar3 - (long)pTVar2 >> 4) + sVar1 == 0) {
      return;
    }
    if (pTVar2 == pTVar3) {
      if (sVar1 == 0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Heap2LocalPass, wasm::Visitor<wasm::(anonymous namespace)::Heap2LocalPass>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Heap2LocalPass, wasm::Visitor<wasm::(anonymous namespace)::Heap2LocalPass>>::Task, N = 10]"
                     );
      }
      p_Var4 = (this->stack).fixed._M_elems[sVar1 - 1].func;
      ppEVar5 = (this->stack).fixed._M_elems[sVar1 - 1].currp;
      (this->stack).usedFixed = sVar1 - 1;
    }
    else {
      p_Var4 = pTVar3[-1].func;
      ppEVar5 = pTVar3[-1].currp;
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar3 + -1;
    }
    this->replacep = ppEVar5;
    if (*ppEVar5 == (Expression *)0x0) break;
    (*p_Var4)((Heap2LocalPass *)(this[-1].stack.fixed._M_elems + 7),ppEVar5);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<wasm::(anonymous namespace)::Heap2LocalPass, wasm::Visitor<wasm::(anonymous namespace)::Heap2LocalPass>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Heap2LocalPass, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Heap2LocalPass>]"
               );
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }